

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsdf.c
# Opt level: O1

void sdf_contour_done(FT_Memory memory,SDF_Contour **contour)

{
  SDF_Edge_ *pSVar1;
  SDF_Edge *P;
  
  if ((contour != (SDF_Contour **)0x0 && memory != (FT_Memory)0x0) &&
     (*contour != (SDF_Contour *)0x0)) {
    P = (*contour)->edges;
    while (P != (SDF_Edge *)0x0) {
      pSVar1 = P->next;
      ft_mem_free(memory,P);
      P = pSVar1;
    }
    ft_mem_free(memory,*contour);
    *contour = (SDF_Contour *)0x0;
  }
  return;
}

Assistant:

static void
  sdf_contour_done( FT_Memory      memory,
                    SDF_Contour**  contour )
  {
    SDF_Edge*  edges;
    SDF_Edge*  temp;


    if ( !memory || !contour || !*contour )
      return;

    edges = (*contour)->edges;

    /* release all edges */
    while ( edges )
    {
      temp  = edges;
      edges = edges->next;

      sdf_edge_done( memory, &temp );
    }

    FT_FREE( *contour );
  }